

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O2

bool __thiscall
axl::sys::NameableEventBase<axl::sl::False>::create(NameableEventBase<axl::sl::False> *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  this->m_event = (EventImpl *)&this->field_3;
  CondMutexEventBase<axl::sl::False>::CondMutexEventBase
            ((CondMutexEventBase<axl::sl::False> *)&this->field_3);
  return true;
}

Assistant:

bool
	create() {
		close();

		m_event = (EventImpl*)m_unnamedEventBuffer;
		new(m_event) EventImpl;
		return true;
	}